

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

TimeZoneNames * icu_63::TimeZoneNames::createInstance(Locale *locale,UErrorCode *status)

{
  UBool UVar1;
  TimeZoneNamesDelegate *this;
  UErrorCode *size;
  TimeZoneNamesDelegate *local_48;
  TimeZoneNamesDelegate *local_20;
  TimeZoneNames *instance;
  UErrorCode *status_local;
  Locale *locale_local;
  
  local_20 = (TimeZoneNamesDelegate *)0x0;
  size = status;
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    this = (TimeZoneNamesDelegate *)UMemory::operator_new((UMemory *)0x10,(size_t)size);
    local_48 = (TimeZoneNamesDelegate *)0x0;
    if (this != (TimeZoneNamesDelegate *)0x0) {
      TimeZoneNamesDelegate::TimeZoneNamesDelegate(this,locale,status);
      local_48 = this;
    }
    local_20 = local_48;
    if ((local_48 == (TimeZoneNamesDelegate *)0x0) && (UVar1 = ::U_SUCCESS(*status), UVar1 != '\0'))
    {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return &local_20->super_TimeZoneNames;
}

Assistant:

TimeZoneNames*
TimeZoneNames::createInstance(const Locale& locale, UErrorCode& status) {
    TimeZoneNames *instance = NULL;
    if (U_SUCCESS(status)) {
        instance = new TimeZoneNamesDelegate(locale, status);
        if (instance == NULL && U_SUCCESS(status)) {
            status = U_MEMORY_ALLOCATION_ERROR;
        }
    }
    return instance;
}